

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

AsmJsModuleInfo * __thiscall Js::FunctionBody::AllocateAsmJsModuleInfo(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  AsmJsModuleInfo *pAVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  TrackAllocData local_40;
  Recycler *local_18;
  Recycler *rec;
  FunctionBody *this_local;
  
  rec = (Recycler *)this;
  pAVar3 = GetAsmJsModuleInfo(this);
  if (pAVar3 != (AsmJsModuleInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1996,"(!this->GetAsmJsModuleInfo())",
                                "!this->GetAsmJsModuleInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar5 = ScriptContext::GetRecycler
                     ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
  local_18 = pRVar5;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&AsmJsModuleInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0x1998);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_40);
  pAVar3 = (AsmJsModuleInfo *)new<Memory::Recycler>(0xb0,pRVar5,0x43c4b0);
  AsmJsModuleInfo::AsmJsModuleInfo(pAVar3,local_18);
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)3,Js::AsmJsModuleInfo*>
            ((FunctionProxy *)this,pAVar3);
  pAVar3 = GetAsmJsModuleInfo(this);
  return pAVar3;
}

Assistant:

AsmJsModuleInfo* FunctionBody::AllocateAsmJsModuleInfo()
    {
        Assert( !this->GetAsmJsModuleInfo() );
        Recycler* rec = m_scriptContext->GetRecycler();
        this->SetAuxPtr<AuxPointerType::AsmJsModuleInfo>(RecyclerNew(rec, AsmJsModuleInfo, rec));
        return this->GetAsmJsModuleInfo();
    }